

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot.cpp
# Opt level: O1

fsm_def * fsm_from_file(fsm_def *__return_storage_ptr__,path *input_file_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  size_type sVar3;
  char cVar4;
  ostream *poVar5;
  long *plVar6;
  long *plVar7;
  _Alloc_hider _Var8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type sVar12;
  size_type sVar13;
  bool bVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string transistions_chunk;
  string line;
  ifstream file;
  is_classifiedF local_2c8;
  long local_2b8;
  long lStack_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  fsm_def *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  long *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_288 = __return_storage_ptr__;
  fsm_def::fsm_def(__return_storage_ptr__);
  std::ifstream::ifstream(local_238,(string *)input_file_path,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to open file: ",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(input_file_path->m_pathname)._M_dataplus._M_p,
                        (input_file_path->m_pathname)._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading statemachine from: ",0x1b);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(input_file_path->m_pathname)._M_dataplus._M_p,
                      (input_file_path->m_pathname)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
  lVar2 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar2] & 2) == 0) {
    plVar7 = (long *)0x0;
    do {
      local_240 = plVar7;
      cVar4 = std::ios::widen((char)&local_2c8 + (char)lVar2 + -0x70);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_260,cVar4);
      std::locale::locale((locale *)&local_280);
      local_2c8.m_Type = 0x2000;
      std::locale::locale(&local_2c8.m_Locale,(locale *)&local_280);
      boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
                (&local_260,&local_2c8);
      std::locale::~locale(&local_2c8.m_Locale);
      std::locale::~locale((locale *)&local_280);
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_260._M_dataplus._M_p + local_260._M_string_length);
      paVar10 = paVar1;
      _Var8._M_p = local_260._M_dataplus._M_p;
      paVar11 = paVar1;
      sVar3 = local_260._M_string_length;
      if (local_260._M_string_length != 0) {
        do {
          sVar12 = 0;
          do {
            sVar13 = sVar12;
            if ((_Var8._M_p[sVar12] != ".transitions_from"[sVar12]) ||
               (sVar13 = sVar12 + 1, sVar3 - 1 == sVar12)) break;
            bVar14 = sVar12 != 0x10;
            sVar12 = sVar13;
          } while (bVar14);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var8._M_p;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(_Var8._M_p + sVar13);
        } while ((sVar13 != 0x11) &&
                (_Var8._M_p = _Var8._M_p + 1, paVar10 = paVar1, paVar11 = paVar1, sVar3 = sVar3 - 1,
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var8._M_p != paVar1));
      }
      if (paVar10 == paVar11) {
        paVar10 = paVar1;
        _Var8._M_p = local_260._M_dataplus._M_p;
        paVar11 = paVar1;
        sVar3 = local_260._M_string_length;
        if (local_260._M_string_length != 0) {
          do {
            sVar12 = 0;
            do {
              sVar13 = sVar12;
              if ((_Var8._M_p[sVar12] != ".end_transitions"[sVar12]) ||
                 (sVar13 = sVar12 + 1, sVar3 - 1 == sVar12)) break;
              bVar14 = sVar12 != 0xf;
              sVar12 = sVar13;
            } while (bVar14);
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var8._M_p;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(_Var8._M_p + sVar13);
          } while ((sVar13 != 0x10) &&
                  (_Var8._M_p = _Var8._M_p + 1, paVar10 = paVar1, paVar11 = paVar1,
                  sVar3 = sVar3 - 1,
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var8._M_p != paVar1));
        }
        if (paVar10 == paVar11) {
          paVar10 = paVar1;
          _Var8._M_p = local_260._M_dataplus._M_p;
          paVar11 = paVar1;
          sVar3 = local_260._M_string_length;
          if (local_260._M_string_length != 0) {
            do {
              sVar12 = 0;
              do {
                sVar13 = sVar12;
                if ((_Var8._M_p[sVar12] != ".otherwise_loop"[sVar12]) ||
                   (sVar13 = sVar12 + 1, sVar3 - 1 == sVar12)) break;
                bVar14 = sVar12 != 0xe;
                sVar12 = sVar13;
              } while (bVar14);
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var8._M_p;
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(_Var8._M_p + sVar13);
            } while ((sVar13 != 0xf) &&
                    (_Var8._M_p = _Var8._M_p + 1, paVar10 = paVar1, paVar11 = paVar1,
                    sVar3 = sVar3 - 1,
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var8._M_p != paVar1));
          }
          plVar7 = local_240;
          if (paVar10 == paVar11 && local_260._M_string_length != 0) goto LAB_00105e5a;
        }
        if (local_260._M_string_length != 0) {
          local_2c8._0_8_ = &local_2b8;
          std::__cxx11::string::_M_construct<char*>((string *)&local_2c8);
          std::__cxx11::string::append((char *)&local_2c8);
          std::__cxx11::string::_M_append((char *)&local_2a8,local_2c8._0_8_);
          if ((long *)local_2c8._0_8_ != &local_2b8) {
            operator_delete((void *)local_2c8._0_8_,local_2b8 + 1);
          }
        }
        if (local_2a8._M_string_length != 0) {
          std::operator+(&local_280,"   ",&local_2a8);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_280);
          plVar6 = plVar7 + 2;
          if ((long *)*plVar7 == plVar6) {
            local_2b8 = *plVar6;
            lStack_2b0 = plVar7[3];
            local_2c8._0_8_ = &local_2b8;
          }
          else {
            local_2b8 = *plVar6;
            local_2c8._0_8_ = (long *)*plVar7;
          }
          local_2c8._8_8_ = plVar7[1];
          *plVar7 = (long)plVar6;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_2c8);
          if ((long *)local_2c8._0_8_ != &local_2b8) {
            operator_delete((void *)local_2c8._0_8_,local_2b8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          parse_cpp_fsm_part<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (local_288,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_2a8._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_2a8._M_dataplus._M_p + local_2a8._M_string_length));
        }
        plVar7 = (long *)0x0;
LAB_00105e52:
        local_2a8._M_string_length = 0;
        *local_2a8._M_dataplus._M_p = '\0';
      }
      else {
        plVar7 = (long *)CONCAT71((int7)((ulong)local_240 >> 8),1);
        if (((ulong)local_240 & 1) != 0) {
          if (local_2a8._M_string_length != 0) {
            std::operator+(&local_280,"   ",&local_2a8);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_280);
            plVar7 = &local_2b8;
            plVar9 = plVar6 + 2;
            if ((long *)*plVar6 == plVar9) {
              local_2b8 = *plVar9;
              lStack_2b0 = plVar6[3];
              local_2c8._0_8_ = plVar7;
            }
            else {
              local_2b8 = *plVar9;
              local_2c8._0_8_ = (long *)*plVar6;
            }
            local_2c8._8_8_ = plVar6[1];
            *plVar6 = (long)plVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_2c8);
            if ((long *)local_2c8._0_8_ != plVar7) {
              operator_delete((void *)local_2c8._0_8_,local_2b8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
            parse_cpp_fsm_part<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (local_288,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_2a8._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_2a8._M_dataplus._M_p + local_2a8._M_string_length));
          }
          plVar7 = (long *)CONCAT71((int7)((ulong)plVar7 >> 8),1);
          goto LAB_00105e52;
        }
      }
LAB_00105e5a:
      if ((((ulong)plVar7 & 1) != 0) && (local_260._M_string_length != 0)) {
        local_2c8._0_8_ = &local_2b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,local_260._M_dataplus._M_p,
                   local_260._M_dataplus._M_p + local_260._M_string_length);
        std::__cxx11::string::append((char *)&local_2c8);
        std::__cxx11::string::_M_append((char *)&local_2a8,local_2c8._0_8_);
        if ((long *)local_2c8._0_8_ != &local_2b8) {
          operator_delete((void *)local_2c8._0_8_,local_2b8 + 1);
        }
      }
      lVar2 = *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[lVar2] & 2) == 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return local_288;
}

Assistant:

fsm_def fsm_from_file(const boost::filesystem::path& input_file_path)
{
    namespace ba = boost::algorithm;
    fsm_def sm;
    std::ifstream file (input_file_path.native());
    if (file.is_open()) {
        std::cout << "Reading statemachine from: " << input_file_path.native() << std::endl;
        std::string line;
        std::string transistions_chunk ("");
        bool in_transistions_chunk = false;
        while (!file.eof()) {
            std::getline(file, line);
            boost::algorithm::trim(line);
            if (ba::contains(line, ".transitions_from")) {
                if (in_transistions_chunk) {
                    if (!transistions_chunk.empty()) {
                        transistions_chunk = "   " + transistions_chunk + "  ;";
//                        std::cout << "--- parse transistions_chunk ---\n'" << transistions_chunk << "'" << std::endl;
                        parse_cpp_fsm_part(sm, transistions_chunk.begin(), transistions_chunk.end());
                    }
                    transistions_chunk.clear();
                }
                in_transistions_chunk = true;
            }
            else if ( ba::contains(line, ".end_transitions") ||
                 ba::contains(line, ".otherwise_loop") ||
                 line.empty()
               ) {
                in_transistions_chunk = false;
                if (!line.empty()) {
                    transistions_chunk.append(line + "\n");
                }
                if (!transistions_chunk.empty()) {
                    transistions_chunk = "   " + transistions_chunk + "  ;";
//                    std::cout << "--- parse transistions_chunk ---\n'" << transistions_chunk << "'" << std::endl;
                    parse_cpp_fsm_part(sm, transistions_chunk.begin(), transistions_chunk.end());
                }
                transistions_chunk.clear();
            }
            if (in_transistions_chunk) {
                if (!line.empty()) {
                    transistions_chunk.append(line + "\n");
                }
            }
        }
    }
    else {
        std::cout << "Unable to open file: " << input_file_path.native() << std::endl;
        exit(1);
    }

    return sm;
}